

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsSealed
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance)

{
  byte bVar1;
  bool bVar2;
  BOOL BVar3;
  BOOL BVar4;
  int iVar5;
  int iVar6;
  IndexPropertyDescriptor *pIVar7;
  ES5Array *arr;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  
  BVar3 = DictionaryTypeHandlerBase<int>::IsSealed
                    (&this->super_DictionaryTypeHandlerBase<int>,instance);
  BVar4 = 0;
  if (BVar3 != 0) {
    this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
    iVar5 = this_00->count - this_00->freeCount;
    bVar2 = 0 < iVar5;
    if (0 < iVar5) {
      iVar5 = 0;
      do {
        pIVar7 = JsUtil::
                 BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt(this_00,iVar5);
        if ((pIVar7->Attributes & 8) == 0) {
          bVar1 = pIVar7->Attributes >> 1;
        }
        else {
          bVar1 = 0;
        }
        if ((bVar1 & 1) != 0) {
          if (bVar2) {
            return 0;
          }
          break;
        }
        iVar5 = iVar5 + 1;
        this_00 = (((this->indexPropertyMap).ptr)->indexPropertyMap).ptr;
        iVar6 = this_00->count - this_00->freeCount;
        bVar2 = iVar5 < iVar6;
      } while (iVar5 < iVar6);
    }
    if ((this->dataItemAttributes & 2) != 0) {
      arr = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
      bVar2 = HasAnyDataItemNotInMap(this,arr);
      if (bVar2) {
        return 0;
      }
    }
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsSealed(DynamicObject* instance)
    {
        if (!__super::IsSealed(instance))
        {
            return false;
        }

        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            IndexPropertyDescriptor* descriptor = indexPropertyMap->GetReferenceAt(i);
            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip deleted
            }
            if (descriptor->Attributes & PropertyConfigurable)
            {
                //[[Configurable]] must be false for all properties.
                return false;
            }
        }

        // Check data item not in map
        if (this->GetDataItemAttributes() & PropertyConfigurable)
        {
            if (HasAnyDataItemNotInMap(VarTo<ES5Array>(instance)))
            {
                return false;
            }
        }

        return true;
    }